

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

string * __thiscall leveldb::ParsedInternalKey::DebugString_abi_cxx11_(ParsedInternalKey *this)

{
  ostream *poVar1;
  Slice *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  ostringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  Slice *in_stack_fffffffffffffdc8;
  Slice *in_stack_fffffffffffffde0;
  string local_1a0 [32];
  ostringstream local_180 [376];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream(local_180);
  poVar1 = std::operator<<((ostream *)local_180,'\'');
  Slice::ToString_abi_cxx11_(in_RSI);
  Slice::Slice(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  EscapeString_abi_cxx11_(in_stack_fffffffffffffde0);
  poVar1 = std::operator<<(poVar1,local_1a0);
  poVar1 = std::operator<<(poVar1,"\' @ ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ulong)in_RSI[1].data_);
  poVar1 = std::operator<<(poVar1," : ");
  std::ostream::operator<<(poVar1,(int)in_RSI[1].size_);
  std::__cxx11::string::~string(in_stack_fffffffffffffdb8);
  std::__cxx11::string::~string(in_stack_fffffffffffffdb8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string ParsedInternalKey::DebugString() const {
  std::ostringstream ss;
  ss << '\'' << EscapeString(user_key.ToString()) << "' @ " << sequence << " : "
     << static_cast<int>(type);
  return ss.str();
}